

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

char * __thiscall QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame(QGles2Buffer *this)

{
  bool bVar1;
  char *pcVar2;
  QByteArray *in_RDI;
  QOpenGLExtraFunctions *unaff_retaddr;
  QRhiGles2 *rhiD;
  GLuint in_stack_ffffffffffffffd8;
  UsageFlag in_stack_ffffffffffffffdc;
  QByteArray *offset;
  undefined8 in_stack_fffffffffffffff8;
  GLenum target;
  
  target = (GLenum)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  offset = in_RDI;
  bVar1 = QFlags<QRhiBuffer::UsageFlag>::testFlag
                    ((QFlags<QRhiBuffer::UsageFlag> *)in_RDI,in_stack_ffffffffffffffdc);
  if (!bVar1) {
    pcVar2 = (in_RDI->d).ptr;
    QOpenGLFunctions::glBindBuffer
              ((QOpenGLFunctions *)in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if ((*(uint *)(pcVar2 + 0x24c) >> 0x19 & 1) != 0) {
      pcVar2 = (char *)QOpenGLExtraFunctions::glMapBufferRange
                                 (unaff_retaddr,target,(GLintptr)offset,(GLsizeiptr)pcVar2,
                                  (GLbitfield)((ulong)in_RDI >> 0x20));
      return pcVar2;
    }
    bVar1 = QByteArray::isEmpty((QByteArray *)0x92c455);
    if (bVar1) {
      QByteArray::resize((longlong)(in_RDI + 3));
    }
  }
  pcVar2 = QByteArray::data(in_RDI);
  return pcVar2;
}

Assistant:

char *QGles2Buffer::beginFullDynamicBufferUpdateForCurrentFrame()
{
    Q_ASSERT(m_type == Dynamic);
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        if (rhiD->caps.properMapBuffer) {
            return static_cast<char *>(rhiD->f->glMapBufferRange(targetForDataOps, 0, nonZeroSize,
                                                                 GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
        } else {
            // Need some storage for the data, use the otherwise unused 'data' member.
            if (data.isEmpty())
                data.resize(nonZeroSize);
        }
    }
    return data.data();
}